

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O0

void write_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  bs_t *b_local;
  h264_stream_t *h_local;
  
  write_rbsp_trailing_bits(h,b);
  return;
}

Assistant:

void write_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    write_rbsp_trailing_bits(h, b);

    if( h->pps->entropy_coding_mode_flag )
    {
        /*
        // 9.3.4.6 Byte stuffing process (informative)
        // NOTE do not write any cabac_zero_word for now - this appears to be optional
        while( more_rbsp_trailing_data(h, b) )
        {
            bs_write_f(b,16, 0x0000); // cabac_zero_word
        }
        */
    }
}